

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcache1Shrink(sqlite3_pcache *p)

{
  undefined4 uVar1;
  long lVar2;
  PCache1 *pCache;
  
  if (*(int *)(p + 0x14) != 0) {
    lVar2 = *(long *)p;
    uVar1 = *(undefined4 *)(lVar2 + 8);
    *(undefined4 *)(lVar2 + 8) = 0;
    pcache1EnforceMaxPage((PCache1 *)p);
    *(undefined4 *)(lVar2 + 8) = uVar1;
  }
  return;
}

Assistant:

static void pcache1Shrink(sqlite3_pcache *p){
  PCache1 *pCache = (PCache1*)p;
  if( pCache->bPurgeable ){
    PGroup *pGroup = pCache->pGroup;
    int savedMaxPage;
    pcache1EnterMutex(pGroup);
    savedMaxPage = pGroup->nMaxPage;
    pGroup->nMaxPage = 0;
    pcache1EnforceMaxPage(pCache);
    pGroup->nMaxPage = savedMaxPage;
    pcache1LeaveMutex(pGroup);
  }
}